

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> embree::SceneGraph::loadPLY(FileName *fileName)

{
  Node *in_RDI;
  PlyParser *in_stack_fffffffffffffd68;
  FileName *in_stack_fffffffffffffee8;
  PlyParser *in_stack_fffffffffffffef0;
  _func_int **local_30 [4];
  undefined8 *local_10;
  
  PlyParser::PlyParser(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_10 = local_30;
  (in_RDI->super_RefCount)._vptr_RefCount = local_30[0];
  local_30[0] = (_func_int **)0x0;
  PlyParser::~PlyParser(in_stack_fffffffffffffd68);
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<Node> loadPLY(const FileName& fileName) {
      return PlyParser(fileName).scene;
    }